

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

bool __thiscall Liby::http::RequestParser::ParseHeader(RequestParser *this,char *begin,char *end)

{
  char *__end;
  undefined8 __beg;
  char *pcVar1;
  int iVar2;
  mapped_type *this_00;
  bool bVar3;
  allocator<char> local_a1;
  string local_a0 [8];
  string value;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string key;
  char *right;
  char *left;
  char *local_30;
  char *mid;
  char *end_local;
  char *begin_local;
  RequestParser *this_local;
  
  bVar3 = false;
  if ((begin <= end) && (bVar3 = false, begin != (char *)0x0)) {
    bVar3 = end != (char *)0x0;
  }
  mid = end;
  end_local = begin;
  begin_local = (char *)this;
  if (bVar3) {
    left._7_1_ = 0x3a;
    local_30 = std::find<char_const*,char>(begin,end,(char *)((long)&left + 7));
    if (local_30 == (char *)0x0) {
      this->progress_ = 9;
      this_local._7_1_ = 0;
    }
    else {
      key.field_2._8_8_ = local_30 + 1;
      pcVar1 = local_30;
      do {
        __end = pcVar1;
        right = __end + -1;
        iVar2 = isspace((int)*right);
        pcVar1 = right;
      } while (iVar2 != 0);
      while (iVar2 = isspace((int)*(char *)key.field_2._8_8_), pcVar1 = end_local, iVar2 != 0) {
        key.field_2._8_8_ = key.field_2._8_8_ + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)local_68,pcVar1,__end,&local_69);
      std::allocator<char>::~allocator(&local_69);
      pcVar1 = mid;
      __beg = key.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>(local_a0,(char *)__beg,pcVar1,&local_a1);
      std::allocator<char>::~allocator(&local_a1);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&(this->super_Request).headers_,(key_type *)local_68);
      std::__cxx11::string::operator=((string *)this_00,local_a0);
      this_local._7_1_ = 1;
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string((string *)local_68);
    }
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("begin <= end && begin && end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                ,0x105,"bool Liby::http::RequestParser::ParseHeader(const char *, const char *)");
}

Assistant:

bool RequestParser::ParseHeader(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    const char *mid = std::find(begin, end, ':');
    if (mid == nullptr) {
        progress_ = InvalidHeader;
        return false;
    }

    const char *left = mid - 1;
    const char *right = mid + 1;
    while (std::isspace(*left))
        left--;
    while (std::isspace(*right))
        right++;
    std::string key(begin, left + 1);
    std::string value(right, end);
    headers_[key] = value;
    return true;
}